

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamfilters.h
# Opt level: O1

int __thiscall embree::LineCommentFilter::next(LineCommentFilter *this)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  size_t n;
  bool bVar4;
  
  bVar4 = (this->lineComment)._M_string_length != 0;
  if (bVar4) {
    piVar3 = Stream<int>::peek((this->cin).ptr);
    if (*piVar3 == (int)*(this->lineComment)._M_dataplus._M_p) {
      uVar1 = 1;
      do {
        n = uVar1;
        Stream<int>::get((this->cin).ptr);
        bVar4 = n < (this->lineComment)._M_string_length;
        if (!bVar4) goto LAB_0013350e;
        piVar3 = Stream<int>::peek((this->cin).ptr);
        uVar1 = n + 1;
      } while (*piVar3 == (int)(this->lineComment)._M_dataplus._M_p[n]);
    }
    else {
      n = 0;
    }
    Stream<int>::unget((this->cin).ptr,n);
    if (bVar4) goto LAB_0013351c;
  }
LAB_0013350e:
  while ((piVar3 = Stream<int>::peek((this->cin).ptr), *piVar3 != 10 &&
         (piVar3 = Stream<int>::peek((this->cin).ptr), *piVar3 != -1))) {
    Stream<int>::get((this->cin).ptr);
  }
LAB_0013351c:
  iVar2 = Stream<int>::get((this->cin).ptr);
  return iVar2;
}

Assistant:

int next()
    {
      /* look if the line comment starts here */
      for (size_t j=0; j<lineComment.size(); j++) {
        if (cin->peek() != lineComment[j]) { cin->unget(j); goto not_found; }
        cin->get();
      }
      /* eat all characters until the end of the line (or file) */
      while (cin->peek() != '\n' && cin->peek() != EOF) cin->get();

    not_found:
      return cin->get();
    }